

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O0

void __thiscall
sjtu::map<long,_sjtu::LRUCache<sjtu::userType>::CacheNode_*,_std::less<long>_>::left_rotate
          (map<long,_sjtu::LRUCache<sjtu::userType>::CacheNode_*,_std::less<long>_> *this,Node *x)

{
  Node *pNVar1;
  Node *y;
  Node *x_local;
  map<long,_sjtu::LRUCache<sjtu::userType>::CacheNode_*,_std::less<long>_> *this_local;
  
  pNVar1 = x->parent;
  if (x->left != this->nil) {
    x->left->parent = pNVar1;
  }
  pNVar1->right = x->left;
  if (pNVar1->parent->left == pNVar1) {
    pNVar1->parent->left = x;
  }
  else {
    pNVar1->parent->right = x;
  }
  x->parent = pNVar1->parent;
  pNVar1->parent = x;
  x->left = pNVar1;
  return;
}

Assistant:

void left_rotate(Node *x)
	{
		Node *y = x -> parent;
		if (x -> left != nil) x -> left -> parent = y;
		y -> right = x -> left;
		if (y -> parent -> left == y) y -> parent -> left = x;
		else y -> parent -> right = x;
		x -> parent = y -> parent , y -> parent = x , x -> left = y;
	}